

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * string_from_abi_cxx11_(string *__return_storage_ptr__,bool value)

{
  char *__s;
  undefined7 in_register_00000031;
  allocator<char> local_9;
  
  __s = "false";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    __s = "true";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string string_from(bool value) {
    return value ? "true" : "false";
}